

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O2

void * __thiscall Span::malloc(Span *this,size_t __size)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = -1;
  do {
    bVar1 = BitMap::Get(&this->bitmap,(int)lVar2 + 1);
    lVar2 = (long)(int)lVar2 + 1;
  } while (bVar1);
  BitMap::Set(&this->bitmap,(int)lVar2);
  this->allocCount = this->allocCount + 1;
  return (void *)(this->elemsize * lVar2 + (long)this->startAddr);
}

Assistant:

void *Span::malloc() {
  for (int i = 0; i < nelems; i++) {
    if (bitmap.Get(i) == 0) {
      bitmap.Set(i);
      allocCount++;
      // 注意这个地址的计算要测试一下
      return (void *)((char *)startAddr + elemsize * i);
    }
  }
}